

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int32_t testing::internal::Int32FromEnvOrDie(char *var,int32_t default_val)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  int32_t in_ESI;
  int32_t result;
  char *str_val;
  int32_t *in_stack_00000068;
  char *in_stack_00000070;
  Message *in_stack_00000078;
  char (*in_stack_ffffffffffffff98) [35];
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  Message *in_stack_ffffffffffffffd0;
  undefined4 local_24;
  undefined4 local_4;
  
  pcVar3 = posix::GetEnv((char *)0x188317);
  local_4 = in_ESI;
  if (pcVar3 != (char *)0x0) {
    Message::Message(in_stack_ffffffffffffffd0);
    Message::operator<<((Message *)
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                        in_stack_ffffffffffffff98);
    Message::operator<<((Message *)
                        CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                        (char **)in_stack_ffffffffffffff98);
    bVar1 = ParseInt32(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    bVar2 = bVar1 ^ 0xff;
    Message::~Message((Message *)0x18839c);
    if ((bVar2 & 1) != 0) {
      exit(1);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

int32_t Int32FromEnvOrDie(const char* var, int32_t default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == nullptr) {
    return default_val;
  }

  int32_t result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}